

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void ts_stack_record_summary(Stack *self,StackVersion version,uint max_depth)

{
  uint32_t *puVar1;
  TSStateId TVar2;
  uint32_t uVar3;
  StackNode *pSVar4;
  uint uVar5;
  StackNode *pSVar6;
  Subtree *pSVar7;
  undefined8 uVar8;
  uint32_t uVar9;
  byte bVar10;
  uint uVar11;
  StackSummary *pSVar12;
  StackIterator *pSVar13;
  long lVar14;
  long lVar15;
  StackNode *pSVar16;
  ulong uVar17;
  StackIterator *pSVar18;
  uint uVar19;
  ulong uVar20;
  SubtreeArray *pSVar21;
  uint uVar22;
  _Bool *p_Var23;
  ulong uVar24;
  uint uVar25;
  SubtreeHeapData *pSVar26;
  StackSummaryEntry *local_80;
  ulong local_70;
  
  pSVar12 = (StackSummary *)calloc(1,0x10);
  if (pSVar12 == (StackSummary *)0x0) {
LAB_00131c46:
    ts_stack_record_summary_cold_6();
  }
  else {
    uVar11 = 0;
    (self->slices).size = 0;
    (self->iterators).size = 0;
    if (version < (self->heads).size) {
      pSVar4 = (self->heads).contents[version].node;
      if ((self->iterators).capacity == 0) {
        pSVar18 = (self->iterators).contents;
        if (pSVar18 == (StackIterator *)0x0) {
          pSVar18 = (StackIterator *)&DAT_00000008;
          uVar11 = 0x20;
          pSVar13 = (StackIterator *)calloc(8,0x20);
          if (pSVar13 == (StackIterator *)0x0) goto LAB_00131c6f;
          uVar11 = 0;
        }
        else {
          uVar11 = 0x100;
          pSVar13 = (StackIterator *)realloc(pSVar18,0x100);
          if (pSVar13 == (StackIterator *)0x0) {
            ts_stack_record_summary_cold_1();
LAB_00131c6f:
            ts_stack_record_summary_cold_5();
            if (*(uint *)&(pSVar18->subtrees).contents <= uVar11) {
              __assert_fail("(uint32_t)version < (&self->heads)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x240,"StackSummary *ts_stack_get_summary(Stack *, StackVersion)");
            }
            return;
          }
          uVar11 = (self->iterators).size;
        }
        (self->iterators).contents = pSVar13;
        (self->iterators).capacity = 8;
      }
      pSVar18 = (self->iterators).contents;
      (self->iterators).size = uVar11 + 1;
      pSVar18[uVar11].node = pSVar4;
      pSVar21 = &pSVar18[uVar11].subtrees;
      pSVar21->contents = (Subtree *)0x0;
      pSVar21->size = 0;
      pSVar21->capacity = 0;
      pSVar18[uVar11].subtree_count = 0;
      pSVar18[uVar11].is_pending = true;
      uVar11 = (self->iterators).size;
      if (uVar11 != 0) {
        local_80 = (StackSummaryEntry *)0x0;
        local_70 = 0;
        uVar20 = 0;
        uVar22 = 0;
        do {
          do {
            pSVar18 = (self->iterators).contents;
            uVar25 = pSVar18[uVar22].subtree_count;
            if (max_depth < uVar25) {
LAB_00131b5c:
              ts_subtree_array_delete(self->subtree_pool,&pSVar18[uVar22].subtrees);
              uVar25 = (self->iterators).size;
              if (uVar25 <= uVar22) {
LAB_00131c13:
                __assert_fail("index < self->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                              ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
              }
              pSVar18 = (self->iterators).contents;
              memmove(pSVar18 + uVar22,pSVar18 + (ulong)uVar22 + 1,(ulong)(uVar25 + ~uVar22) << 5);
              puVar1 = &(self->iterators).size;
              *puVar1 = *puVar1 - 1;
              uVar11 = uVar11 - 1;
            }
            else {
              pSVar4 = pSVar18[uVar22].node;
              TVar2 = pSVar4->state;
              lVar15 = uVar20 * 0x14;
              do {
                lVar14 = lVar15;
                lVar15 = lVar14 + -0x14;
                if ((lVar15 == -0x14) ||
                   (uVar19 = *(uint *)((long)local_80 + lVar14 + -8), uVar19 < uVar25)) {
                  uVar19 = (uint)local_70;
                  pSVar16 = pSVar4;
                  if ((uint)uVar20 == uVar19) {
                    uVar5 = uVar19 * 2;
                    if (uVar19 * 2 < 9) {
                      uVar5 = 8;
                    }
                    uVar20 = local_70;
                    if (uVar19 < uVar5) {
                      if (local_80 == (StackSummaryEntry *)0x0) {
                        local_80 = (StackSummaryEntry *)calloc((ulong)uVar5,0x14);
                        if (local_80 == (StackSummaryEntry *)0x0) goto LAB_00131c3c;
                      }
                      else {
                        local_80 = (StackSummaryEntry *)realloc(local_80,(ulong)uVar5 * 0x14);
                        if (local_80 == (StackSummaryEntry *)0x0) {
                          ts_stack_record_summary_cold_2();
LAB_00131c3c:
                          ts_stack_record_summary_cold_4();
                          goto LAB_00131c46;
                        }
                        pSVar16 = pSVar18[uVar22].node;
                      }
                      pSVar12->contents = local_80;
                      pSVar12->capacity = uVar5;
                      uVar20 = (ulong)pSVar12->size;
                      local_70 = (ulong)uVar5;
                    }
                  }
                  uVar19 = (int)uVar20 + 1;
                  pSVar12->size = uVar19;
                  uVar3 = (pSVar16->position).bytes;
                  uVar9 = (pSVar16->position).extent.row;
                  local_80[uVar20].position.extent.column = (pSVar16->position).extent.column;
                  local_80[uVar20].position.bytes = uVar3;
                  local_80[uVar20].position.extent.row = uVar9;
                  local_80[uVar20].depth = uVar25;
                  local_80[uVar20].state = TVar2;
                  uVar20 = (ulong)uVar19;
                  break;
                }
              } while ((uVar19 != uVar25) || (*(TSStateId *)((long)local_80 + lVar14 + -4) != TVar2)
                      );
              uVar17 = (ulong)pSVar4->link_count;
              if (pSVar4->link_count == 0) goto LAB_00131b5c;
              p_Var23 = &pSVar4->links[1].is_pending;
              uVar24 = 0;
              do {
                uVar24 = uVar24 + 1;
                if (uVar24 == uVar17) {
                  pSVar16 = pSVar4->links[0].node;
                  pSVar26 = pSVar4->links[0].subtree.ptr;
                  bVar10 = pSVar4->links[0].is_pending;
                  pSVar18 = (self->iterators).contents + uVar22;
LAB_00131afe:
                  pSVar18->node = pSVar16;
                  if (pSVar26 == (SubtreeHeapData *)0x0) {
                    pSVar18->subtree_count = pSVar18->subtree_count + 1;
                  }
                  else {
                    if (((ulong)pSVar26 & 1) == 0) {
                      uVar25 = *(uint *)&pSVar26->field_0x2c >> 2;
                    }
                    else {
                      uVar25 = (uint)((ulong)pSVar26 >> 3) & 0x1fffffff;
                    }
                    if (((uVar25 & 1) != 0) ||
                       (pSVar18->subtree_count = pSVar18->subtree_count + 1, (bVar10 & 1) != 0))
                    goto LAB_00131b36;
                  }
                  pSVar18->is_pending = false;
                }
                else {
                  uVar25 = (self->iterators).size;
                  if (uVar25 < 0x40) {
                    pSVar16 = ((StackLink *)(p_Var23 + -0x10))->node;
                    pSVar26 = ((Subtree *)(p_Var23 + -8))->ptr;
                    bVar10 = *p_Var23;
                    pSVar18 = (self->iterators).contents;
                    pSVar6 = pSVar18[uVar22].node;
                    pSVar7 = pSVar18[uVar22].subtrees.contents;
                    pSVar21 = &pSVar18[uVar22].subtrees;
                    uVar3 = pSVar21->size;
                    uVar9 = pSVar21->capacity;
                    uVar8 = pSVar21[1].contents;
                    if (uVar25 == (self->iterators).capacity) {
                      uVar19 = uVar25 * 2;
                      if (uVar25 * 2 < 9) {
                        uVar19 = 8;
                      }
                      pSVar18 = (StackIterator *)realloc(pSVar18,(ulong)(uVar19 << 5));
                      if (pSVar18 == (StackIterator *)0x0) {
                        ts_stack_record_summary_cold_3();
                        goto LAB_00131c13;
                      }
                      (self->iterators).contents = pSVar18;
                      (self->iterators).capacity = uVar19;
                      uVar25 = (self->iterators).size;
                    }
                    (self->iterators).size = uVar25 + 1;
                    pSVar21 = &pSVar18[uVar25].subtrees;
                    pSVar21->size = uVar3;
                    pSVar21->capacity = uVar9;
                    pSVar21[1].contents = uVar8;
                    pSVar18[uVar25].node = pSVar6;
                    pSVar18[uVar25].subtrees.contents = pSVar7;
                    uVar3 = (self->iterators).size;
                    if (uVar3 == 0) {
                      __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                    ,0x151,
                                    "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                   );
                    }
                    uVar25 = uVar3 - 1;
                    pSVar13 = (self->iterators).contents;
                    pSVar18 = pSVar13 + uVar25;
                    pSVar21 = &pSVar13[uVar25].subtrees;
                    ts_subtree_array_copy(*pSVar21,pSVar21);
                    goto LAB_00131afe;
                  }
                }
LAB_00131b36:
                uVar17 = (ulong)pSVar4->link_count;
                p_Var23 = p_Var23 + 0x18;
              } while (uVar24 < uVar17);
              uVar22 = uVar22 + 1;
            }
          } while (uVar22 < uVar11);
          uVar11 = (self->iterators).size;
          uVar22 = 0;
        } while (uVar11 != 0);
      }
      (self->heads).contents[version].summary = pSVar12;
      return;
    }
  }
  __assert_fail("(uint32_t)version < (&self->heads)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                ,0x118,
                "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
}

Assistant:

void ts_stack_record_summary(Stack *self, StackVersion version, unsigned max_depth) {
  SummarizeStackSession session = {
    .summary = ts_malloc(sizeof(StackSummary)),
    .max_depth = max_depth
  };
  array_init(session.summary);
  stack__iter(self, version, summarize_stack_callback, &session, -1);
  self->heads.contents[version].summary = session.summary;
}